

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR moveto_op_comp_item(lyxp_set *set1,uint32_t idx1,lyxp_set *set2,char *op,
                          ly_bool switch_operands,ly_bool *result)

{
  LY_ERR local_cc;
  undefined1 local_c8 [4];
  LY_ERR rc;
  lyxp_set tmp1;
  ly_bool *result_local;
  ly_bool switch_operands_local;
  char *op_local;
  lyxp_set *set2_local;
  uint32_t idx1_local;
  lyxp_set *set1_local;
  
  tmp1._136_8_ = result;
  memset(local_c8,0,0x90);
  if (set1->type == LYXP_SET_NODE_SET) {
    if (set2->type == LYXP_SET_BOOLEAN) {
      local_cc = set_comp_cast((lyxp_set *)local_c8,set1,LYXP_SET_BOOLEAN,idx1);
    }
    else if (set2->type == LYXP_SET_NUMBER) {
      local_cc = set_comp_cast((lyxp_set *)local_c8,set1,LYXP_SET_NUMBER,idx1);
    }
    else {
      local_cc = set_comp_cast((lyxp_set *)local_c8,set1,LYXP_SET_STRING,idx1);
    }
    if ((local_cc == LY_SUCCESS) &&
       (local_cc = set_comp_canonize(set2,(set1->val).nodes + idx1), local_cc == LY_SUCCESS)) {
      if (switch_operands == '\0') {
        local_cc = moveto_op_comp((lyxp_set *)local_c8,set2,op,(ly_bool *)tmp1._136_8_);
      }
      else {
        local_cc = moveto_op_comp(set2,(lyxp_set *)local_c8,op,(ly_bool *)tmp1._136_8_);
      }
    }
    lyxp_set_free_content((lyxp_set *)local_c8);
    return local_cc;
  }
  __assert_fail("set1->type == LYXP_SET_NODE_SET",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/xpath.c",
                0x1c5c,
                "LY_ERR moveto_op_comp_item(const struct lyxp_set *, uint32_t, struct lyxp_set *, const char *, ly_bool, ly_bool *)"
               );
}

Assistant:

static LY_ERR
moveto_op_comp_item(const struct lyxp_set *set1, uint32_t idx1, struct lyxp_set *set2, const char *op,
        ly_bool switch_operands, ly_bool *result)
{
    struct lyxp_set tmp1 = {0};
    LY_ERR rc = LY_SUCCESS;

    assert(set1->type == LYXP_SET_NODE_SET);

    /* cast set1 */
    switch (set2->type) {
    case LYXP_SET_NUMBER:
        rc = set_comp_cast(&tmp1, set1, LYXP_SET_NUMBER, idx1);
        break;
    case LYXP_SET_BOOLEAN:
        rc = set_comp_cast(&tmp1, set1, LYXP_SET_BOOLEAN, idx1);
        break;
    default:
        rc = set_comp_cast(&tmp1, set1, LYXP_SET_STRING, idx1);
        break;
    }
    LY_CHECK_GOTO(rc, cleanup);

    /* canonize set2 */
    LY_CHECK_GOTO(rc = set_comp_canonize(set2, &set1->val.nodes[idx1]), cleanup);

    /* compare recursively and store the result */
    if (switch_operands) {
        LY_CHECK_GOTO(rc = moveto_op_comp(set2, &tmp1, op, result), cleanup);
    } else {
        LY_CHECK_GOTO(rc = moveto_op_comp(&tmp1, set2, op, result), cleanup);
    }

cleanup:
    lyxp_set_free_content(&tmp1);
    return rc;
}